

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **azData,sqlite_int64 *pRowid)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mem *pMVar4;
  Vdbe *pVVar5;
  sqlite3_mutex *psVar6;
  bool bVar7;
  RtreeNode *pNode;
  int iVar8;
  int iVar9;
  i64 iVar10;
  i64 iVar11;
  _func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *iValue;
  _func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *p_Var12;
  ulong uVar13;
  Vdbe *p;
  double dVar14;
  float fVar15;
  float fVar16;
  RtreeNode *pLeaf;
  RtreeCell cell;
  RtreeNode *local_70;
  i64 *local_68;
  RtreeCell local_60;
  
  *(int *)&pVtab[2].zErrMsg = *(int *)&pVtab[2].zErrMsg + 1;
  local_60.iRowid = 0;
  bVar7 = false;
  iVar9 = 0;
  if (1 < nData) {
    local_68 = pRowid;
    if (pVtab[1].field_0xd == '\0') {
      if (pVtab[1].field_0xc != '\0') {
        uVar13 = 0;
        do {
          dVar14 = sqlite3VdbeRealValue(azData[uVar13 + 3]);
          fVar16 = (float)dVar14;
          if (dVar14 < (double)fVar16) {
            fVar16 = (float)(dVar14 * *(double *)(&DAT_00194f20 + (ulong)(dVar14 < 0.0) * 8));
          }
          local_60.aCoord[uVar13].f = fVar16;
          dVar14 = sqlite3VdbeRealValue(azData[uVar13 + 4]);
          fVar15 = (float)dVar14;
          if ((double)fVar15 < dVar14) {
            fVar15 = (float)(dVar14 * *(double *)(&DAT_00194f30 + (ulong)(dVar14 < 0.0) * 8));
          }
          local_60.aCoord[uVar13 + 1].f = fVar15;
          if (fVar15 < fVar16) goto LAB_0018bd84;
          uVar13 = uVar13 + 2;
        } while (uVar13 < (uint)(byte)pVtab[1].field_0xc * 2);
      }
    }
    else if (pVtab[1].field_0xc != '\0') {
      uVar13 = 0;
      do {
        iVar10 = sqlite3VdbeIntValue(azData[uVar13 + 3]);
        local_60.aCoord[uVar13].i = (int)iVar10;
        iVar11 = sqlite3VdbeIntValue(azData[uVar13 + 4]);
        local_60.aCoord[uVar13 + 1].i = (int)iVar11;
        if ((int)iVar11 < (int)iVar10) goto LAB_0018bd84;
        uVar13 = uVar13 + 2;
      } while (uVar13 < (uint)(byte)pVtab[1].field_0xc * 2);
    }
    pMVar4 = azData[2];
    iVar9 = 0;
    uVar1._0_2_ = pMVar4->flags;
    uVar1._2_1_ = pMVar4->enc;
    uVar1._3_1_ = pMVar4->field_0xb;
    if ((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) == 0) {
      iValue = (_func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *)sqlite3VdbeIntValue(pMVar4)
      ;
      pMVar4 = *azData;
      uVar2._0_2_ = pMVar4->flags;
      uVar2._2_1_ = pMVar4->enc;
      uVar2._3_1_ = pMVar4->field_0xb;
      local_60.iRowid = (i64)iValue;
      if ((0xaaaaaaaaU >> (uVar2 & 0x1f) & 1) == 0) {
        p_Var12 = (_func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *)
                  sqlite3VdbeIntValue(pMVar4);
        bVar7 = true;
        iVar8 = 0;
        if (p_Var12 == iValue) goto LAB_0018bda9;
      }
      sqlite3_bind_int64((sqlite3_stmt *)pVtab[5].pModule,1,(sqlite_int64)iValue);
      iVar8 = sqlite3_step((sqlite3_stmt *)pVtab[5].pModule);
      iVar9 = sqlite3_reset((sqlite3_stmt *)pVtab[5].pModule);
      bVar7 = true;
      if (iVar8 == 100) {
        iVar8 = 0;
        if (*(char *)((long)&(pVtab[1].pModule)->xEof + 5) == '\x05') {
          iVar9 = rtreeDeleteRowid((Rtree *)pVtab,(sqlite3_int64)iValue);
          bVar7 = true;
        }
        else {
          iVar8 = 5;
          iVar9 = 0x13;
          bVar7 = false;
        }
      }
      else {
        iVar8 = 0;
      }
      if (bVar7) {
        iVar8 = 0;
      }
    }
    else {
      bVar7 = false;
      iVar8 = 0;
    }
    goto LAB_0018bda9;
  }
  goto LAB_0018bdc1;
LAB_0018bd84:
  bVar7 = false;
  iVar8 = 5;
  iVar9 = 0x13;
LAB_0018bda9:
  if (iVar8 == 5) goto LAB_0018bedc;
  pRowid = local_68;
  if (iVar8 != 0) {
    return iVar9;
  }
LAB_0018bdc1:
  pMVar4 = *azData;
  uVar3._0_2_ = pMVar4->flags;
  uVar3._2_1_ = pMVar4->enc;
  uVar3._3_1_ = pMVar4->field_0xb;
  if ((0xaaaaaaaaU >> (uVar3 & 0x1f) & 1) == 0) {
    iVar10 = sqlite3VdbeIntValue(pMVar4);
    iVar9 = rtreeDeleteRowid((Rtree *)pVtab,iVar10);
  }
  if ((1 < nData) && (iVar9 == 0)) {
    local_70 = (RtreeNode *)0x0;
    iVar9 = 0;
    if (!bVar7) {
      pVVar5 = *(Vdbe **)&pVtab[5].nRef;
      iVar9 = vdbeUnbind(pVVar5,1);
      if ((iVar9 == 0) && (psVar6 = pVVar5->db->mutex, psVar6 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar6);
      }
      pVVar5 = *(Vdbe **)&pVtab[5].nRef;
      iVar9 = vdbeUnbind(pVVar5,2);
      if ((iVar9 == 0) && (psVar6 = pVVar5->db->mutex, psVar6 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar6);
      }
      sqlite3_step(*(sqlite3_stmt **)&pVtab[5].nRef);
      iVar9 = sqlite3_reset(*(sqlite3_stmt **)&pVtab[5].nRef);
      local_60.iRowid = (i64)(pVtab[1].pModule)->xOpen;
    }
    *pRowid = local_60.iRowid;
    if (iVar9 == 0) {
      iVar9 = ChooseLeaf((Rtree *)pVtab,&local_60,0,&local_70);
    }
    pNode = local_70;
    if (iVar9 == 0) {
      *(undefined4 *)&pVtab[3].zErrMsg = 0xffffffff;
      iVar8 = rtreeInsertCell((Rtree *)pVtab,local_70,&local_60,0);
      iVar9 = nodeRelease((Rtree *)pVtab,pNode);
      if (iVar8 != 0) {
        iVar9 = iVar8;
      }
    }
  }
LAB_0018bedc:
  rtreeRelease((Rtree *)pVtab);
  return iVar9;
}

Assistant:

static int rtreeUpdate(
  sqlite3_vtab *pVtab, 
  int nData, 
  sqlite3_value **azData, 
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  int bHaveRowid = 0;             /* Set to 1 after new rowid is determined */

  rtreeReference(pRtree);
  assert(nData>=1);

  cell.iRowid = 0;  /* Used only to suppress a compiler warning */

  /* Constraint handling. A write operation on an r-tree table may return
  ** SQLITE_CONSTRAINT for two reasons:
  **
  **   1. A duplicate rowid value, or
  **   2. The supplied data violates the "x2>=x1" constraint.
  **
  ** In the first case, if the conflict-handling mode is REPLACE, then
  ** the conflicting row can be removed before proceeding. In the second
  ** case, SQLITE_CONSTRAINT must be returned regardless of the
  ** conflict-handling mode specified by the user.
  */
  if( nData>1 ){
    int ii;

    /* Populate the cell.aCoord[] array. The first coordinate is azData[3]. */
    assert( nData==(pRtree->nDim*2 + 3) );
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      for(ii=0; ii<(pRtree->nDim*2); ii+=2){
        cell.aCoord[ii].f = rtreeValueDown(azData[ii+3]);
        cell.aCoord[ii+1].f = rtreeValueUp(azData[ii+4]);
        if( cell.aCoord[ii].f>cell.aCoord[ii+1].f ){
          rc = SQLITE_CONSTRAINT;
          goto constraint;
        }
      }
    }else
#endif
    {
      for(ii=0; ii<(pRtree->nDim*2); ii+=2){
        cell.aCoord[ii].i = sqlite3_value_int(azData[ii+3]);
        cell.aCoord[ii+1].i = sqlite3_value_int(azData[ii+4]);
        if( cell.aCoord[ii].i>cell.aCoord[ii+1].i ){
          rc = SQLITE_CONSTRAINT;
          goto constraint;
        }
      }
    }

    /* If a rowid value was supplied, check if it is already present in 
    ** the table. If so, the constraint has failed. */
    if( sqlite3_value_type(azData[2])!=SQLITE_NULL ){
      cell.iRowid = sqlite3_value_int64(azData[2]);
      if( sqlite3_value_type(azData[0])==SQLITE_NULL
       || sqlite3_value_int64(azData[0])!=cell.iRowid
      ){
        int steprc;
        sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
        steprc = sqlite3_step(pRtree->pReadRowid);
        rc = sqlite3_reset(pRtree->pReadRowid);
        if( SQLITE_ROW==steprc ){
          if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
            rc = rtreeDeleteRowid(pRtree, cell.iRowid);
          }else{
            rc = SQLITE_CONSTRAINT;
            goto constraint;
          }
        }
      }
      bHaveRowid = 1;
    }
  }

  /* If azData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( sqlite3_value_type(azData[0])!=SQLITE_NULL ){
    rc = rtreeDeleteRowid(pRtree, sqlite3_value_int64(azData[0]));
  }

  /* If the azData[] array contains more than one element, elements
  ** (azData[2]..azData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;

    /* Figure out the rowid of the new row. */
    if( bHaveRowid==0 ){
      rc = newRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;

    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      pRtree->iReinsertHeight = -1;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
  }

constraint:
  rtreeRelease(pRtree);
  return rc;
}